

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[34],Diligent::MemorySizeFormatter<unsigned_long>,char[4],Diligent::MemorySizeFormatter<unsigned_long>,char[3],unsigned_long,char_const*>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [34],MemorySizeFormatter<unsigned_long> *RestArgs,
               char (*RestArgs_1) [4],MemorySizeFormatter<unsigned_long> *RestArgs_2,
               char (*RestArgs_3) [3],unsigned_long *RestArgs_4,char **RestArgs_5)

{
  char (*RestArgs_local_3) [3];
  MemorySizeFormatter<unsigned_long> *RestArgs_local_2;
  char (*RestArgs_local_1) [4];
  MemorySizeFormatter<unsigned_long> *RestArgs_local;
  char (*FirstArg_local) [34];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[34]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,Diligent::MemorySizeFormatter<unsigned_long>,char[4],Diligent::MemorySizeFormatter<unsigned_long>,char[3],unsigned_long,char_const*>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}